

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  GMM_PLATFORM_INFO *pGVar7;
  ulong uVar8;
  uint uVar9;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  GMM_PLATFORM_INFO *local_58;
  ulong local_50;
  ulong local_48;
  uint local_3c;
  uint32_t local_38;
  uint32_t CompressHeight;
  
  pGVar7 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  CompressHeight._3_1_ =
       GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  uVar3 = pTexInfo->BaseHeight;
  local_38 = pTexInfo->MaxLod;
  uVar9 = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_68,&local_3c,&local_64);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar5 = 1;
  }
  else {
    uVar5 = (pTexInfo->MSAA).NumSamples;
  }
  uVar3 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar3,uVar9,uVar5);
  if (CompressHeight._3_1_ == '\0') {
    aVar1 = (pTexInfo->Flags).Gpu;
    if (((aVar1._0_4_ >> 0x1d & 1) == 0) || (((pTexInfo->Flags).Info.field_0x4 & 4) == 0)) {
      local_48 = (ulong)(uVar3 >> 4);
      if ((~(ulong)aVar1 & 0x20000000002) != 0) {
        local_48 = (ulong)uVar3;
      }
      goto LAB_001b21e0;
    }
    uVar4 = uVar3 >> 1;
  }
  else {
    uVar4 = uVar3 / local_3c;
  }
  local_48 = (ulong)uVar4;
LAB_001b21e0:
  if ((((pTexInfo->Flags).Info.field_0x4 & 0x60) == 0) ||
     (((pTexInfo->Alignment).MipTailStartLod != 0 && (pTexInfo->MaxLod != 0)))) {
    local_58 = pGVar7;
    local_50 = (ulong)uVar9;
    if (local_38 == 0) {
      uVar9 = 0;
      uVar4 = 0;
    }
    else {
      _CompressWidth = pGVar7->TileInfo;
      uVar8 = 1;
      uVar4 = 0;
      uVar9 = 0;
      do {
        uVar3 = (uint32_t)uVar8;
        if ((((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0) ||
           (uVar3 != (pTexInfo->Alignment).MipTailStartLod)) {
          uVar5 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,uVar8);
          if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
            uVar6 = 1;
          }
          else {
            uVar6 = (pTexInfo->MSAA).NumSamples;
          }
          uVar5 = GmmTextureCalc::ExpandHeight
                            (&this->super_GmmTextureCalc,uVar5,(uint32_t)local_50,uVar6);
          if (CompressHeight._3_1_ == '\0') {
            aVar1 = (pTexInfo->Flags).Gpu;
            if (((aVar1._0_4_ >> 0x1d & 1) == 0) ||
               (((ulong)(pTexInfo->Flags).Info & 0x400000000) == 0)) {
              uVar6 = uVar5 >> 4;
              if ((~(ulong)aVar1 & 0x20000000002) != 0) {
                uVar6 = uVar5;
              }
              bVar2 = false;
            }
            else {
              uVar6 = uVar5 >> 1;
              bVar2 = false;
            }
          }
          else {
            bVar2 = false;
            uVar6 = uVar5 / local_3c;
          }
        }
        else {
          uVar6 = _CompressWidth[pTexInfo->TileMode].LogicalTileHeight;
          bVar2 = true;
        }
        uVar5 = uVar6;
        if (uVar3 == 1) {
          uVar5 = 0;
          uVar4 = uVar6;
        }
        uVar9 = uVar9 + uVar5;
      } while ((!bVar2) && (uVar8 = (ulong)(uVar3 + 1), uVar3 + 1 <= local_38));
    }
    if (((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0) {
      if (uVar4 < uVar9) {
        uVar4 = uVar9;
      }
      local_48 = (ulong)((int)local_48 + ((int)local_50 + -1 + uVar4 & -(int)local_50));
    }
    else {
      if (uVar9 < uVar4) {
        uVar9 = uVar4;
      }
      uVar3 = local_58->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      local_48 = (ulong)(-uVar3 & (uVar3 - 1) + (int)local_48 + uVar9);
    }
  }
  return (uint32_t)local_48;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        HeightLinesLevel0 /= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        HeightLinesLevel0 /= 16;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }
                else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    AlignedHeightLines /= 2;
                }
                else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
                {
                    AlignedHeightLines /= 16;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}